

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O2

void bloaty::wasm::ReadDataSection(Section *section,IndexedNames *names,RangeSink *sink)

{
  size_t this;
  char *pcVar1;
  uint32_t uVar2;
  const_iterator cVar3;
  size_t off;
  size_t in_R8;
  uint __val;
  string_view name_00;
  string_view name_01;
  string_view data;
  string_view sVar4;
  string name;
  string_view local_b8;
  uint32_t local_a4;
  RangeSink *local_a0;
  _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b8 = section->contents;
  local_a0 = sink;
  local_98 = &names->_M_h;
  local_a4 = ReadVarUInt32(&local_b8);
  __val = 0;
  while( true ) {
    sVar4 = local_b8;
    if (local_a4 == __val) {
      return;
    }
    this = local_b8._M_len;
    pcVar1 = local_b8._M_str;
    uVar2 = ReadVarUInt32(&local_b8);
    if (1 < uVar2) break;
    if (uVar2 == 0) {
      SkipInitializerExpression(&local_b8);
    }
    uVar2 = ReadVarUInt32(&local_b8);
    off = (size_t)(((int)local_b8._M_str - (int)sVar4._M_str) + uVar2);
    sVar4._M_str = (char *)0x0;
    sVar4._M_len = (size_t)pcVar1;
    sVar4 = StrictSubstr((bloaty *)this,sVar4,off,in_R8);
    in_R8 = sVar4._M_len;
    data._M_str._0_4_ = uVar2;
    data._M_len = (size_t)local_b8._M_str;
    data._M_str._4_4_ = 0;
    local_b8 = StrictSubstr((bloaty *)local_b8._M_len,data,off);
    local_90._M_dataplus._M_p._0_4_ = __val;
    cVar3 = std::
            _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(local_98,(key_type_conflict *)&local_90);
    if (cVar3.
        super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      std::__cxx11::to_string(&local_70,__val);
      std::operator+(&local_50,"data[",&local_70);
      std::operator+(&local_90,&local_50,"]");
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      name_01._M_str._4_4_ = local_90._M_dataplus._M_p._4_4_;
      name_01._M_str._0_4_ = (uint)local_90._M_dataplus._M_p;
      name_01._M_len = local_90._M_string_length;
      RangeSink::AddFileRange(local_a0,"wasm_data",name_01,sVar4);
      std::__cxx11::string::~string((string *)&local_90);
    }
    else {
      name_00._M_str =
           *(char **)((long)cVar3.
                            super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                            ._M_cur + 0x10);
      name_00._M_len =
           *(size_t *)
            ((long)cVar3.
                   super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                   ._M_cur + 0x18);
      RangeSink::AddFileRange(local_a0,"wasm_data",name_00,sVar4);
    }
    __val = __val + 1;
  }
  Throw("multi-memory extension isn\'t supported",0x16e);
}

Assistant:

void ReadDataSection(const Section& section, const IndexedNames& names,
                     RangeSink* sink) {
  string_view data = section.contents;
  uint32_t count = ReadVarUInt32(&data);

  for (uint32_t i = 0; i < count; i++) {
    string_view segment = data;
    uint32_t mode = ReadVarUInt32(&data);
    if (mode > 1) THROW("multi-memory extension isn't supported");
    if (mode == 0) { // Active segment
      SkipInitializerExpression(&data);
    }

    uint32_t segment_size = ReadVarUInt32(&data);
    uint32_t total_size = segment_size + (data.data() - segment.data());

    segment = StrictSubstr(segment, 0, total_size);
    data = StrictSubstr(data, segment_size);

    auto iter = names.find(i);
    if (iter == names.end()) {
      std::string name = "data[" + std::to_string(i) + "]";
      sink->AddFileRange("wasm_data", name, segment);
    } else {
      sink->AddFileRange("wasm_data", iter->second, segment);
    }
  }
}